

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O2

int __thiscall libtorrent::aux::hash_picker::layers_to_verify(hash_picker *this,node_index idx)

{
  pointer pmVar1;
  bool bVar2;
  int iVar3;
  uint idx_00;
  ulong uVar4;
  int iVar5;
  
  uVar4 = (ulong)idx >> 0x20;
  if (uVar4 == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = file_storage::file_num_pieces(this->m_files,idx.file.m_val);
    iVar3 = merkle_num_leafs(iVar3);
    iVar3 = merkle_num_layers(iVar3);
    pmVar1 = (this->m_merkle_trees->
             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
             ).
             super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = iVar3 + -1;
    iVar5 = 0;
    do {
      idx_00 = merkle_get_parent((int)uVar4);
      uVar4 = (ulong)idx_00;
      bVar2 = merkle_tree::has_node(pmVar1 + idx.file.m_val.m_val,idx_00);
      if (bVar2) {
        return iVar5;
      }
      iVar5 = iVar5 + 1;
    } while (iVar3 != iVar5);
  }
  return iVar3;
}

Assistant:

int hash_picker::layers_to_verify(node_index idx) const
	{
		// the root layer doesn't have a sibling so it should never
		// be requested as a proof layer
		// return -1 to signal to the caller that no proof is required
		// even for the first layer it is trying to verify
		if (idx.node == 0) return -1;

		int layers = 0;
		int const file_internal_layers = merkle_num_layers(merkle_num_leafs(m_files.file_num_pieces(idx.file))) - 1;
		auto const& tree = m_merkle_trees[idx.file];

		for (;;)
		{
			idx.node = merkle_get_parent(idx.node);
			if (tree.has_node(idx.node)) break;
			layers++;
			if (layers == file_internal_layers) return layers;
		}

		return layers;
	}